

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParamGenerator<std::basic_string_view<char,_std::char_traits<char>_>_> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ParamGenerator<std::basic_string_view<char,_std::char_traits<char>_>_> PVar2;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_28;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_20;
  long local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  ValueArray<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
  ::MakeVector<std::basic_string_view<char,std::char_traits<char>>,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>
            (&local_28);
  PVar2 = ValuesIn<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>>
                    ((testing *)this,local_28,local_20);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::basic_string_view<char,_std::char_traits<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_28._M_current != (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
    operator_delete(local_28._M_current,local_18 - (long)local_28._M_current);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::basic_string_view<char,_std::char_traits<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::basic_string_view<char,_std::char_traits<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::basic_string_view<char,_std::char_traits<char>_>_>)
         PVar2.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::basic_string_view<char,_std::char_traits<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(std::make_index_sequence<sizeof...(Ts)>()));
  }